

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileLibraryTargetGenerator::WriteStaticLibraryRules(cmMakefileLibraryTargetGenerator *this)

{
  cmGeneratorTarget *pcVar1;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  bool bVar3;
  string linkLanguage;
  string extraFlags;
  string linkRuleVar;
  string sStack_a8;
  string local_88;
  string local_68;
  string local_48;
  
  pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            (&sStack_a8,&this->super_cmMakefileTargetGenerator);
  bVar3 = requireDeviceLinking(pcVar1,(cmLocalGenerator *)pcVar2,&sStack_a8);
  std::__cxx11::string::~string((string *)&sStack_a8);
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_a8,"CMAKE_CUDA_DEVICE_LINK_LIBRARY",(allocator<char> *)&local_68);
    WriteDeviceLibraryRules(this,&sStack_a8,false);
    std::__cxx11::string::~string((string *)&sStack_a8);
  }
  pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            (&local_68,&this->super_cmMakefileTargetGenerator);
  cmGeneratorTarget::GetLinkerLanguage(&sStack_a8,pcVar1,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            (&local_88,&this->super_cmMakefileTargetGenerator);
  cmGeneratorTarget::GetCreateRuleVariable(&local_68,pcVar1,&sStack_a8,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            (&local_48,&this->super_cmMakefileTargetGenerator);
  cmLocalGenerator::GetStaticLibraryFlags
            ((cmLocalGenerator *)pcVar2,&local_88,&local_48,&sStack_a8,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  std::__cxx11::string::~string((string *)&local_48);
  WriteLibraryRules(this,&local_68,&local_88,false);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&sStack_a8);
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteStaticLibraryRules()
{
  const bool requiresDeviceLinking = requireDeviceLinking(
    *this->GeneratorTarget, *this->LocalGenerator, this->GetConfigName());
  if (requiresDeviceLinking) {
    this->WriteDeviceLibraryRules("CMAKE_CUDA_DEVICE_LINK_LIBRARY", false);
  }

  std::string linkLanguage =
    this->GeneratorTarget->GetLinkerLanguage(this->GetConfigName());

  std::string linkRuleVar = this->GeneratorTarget->GetCreateRuleVariable(
    linkLanguage, this->GetConfigName());

  std::string extraFlags;
  this->LocalGenerator->GetStaticLibraryFlags(
    extraFlags, this->GetConfigName(), linkLanguage, this->GeneratorTarget);
  this->WriteLibraryRules(linkRuleVar, extraFlags, false);
}